

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode39Reader.cpp
# Opt level: O0

string * ZXing::OneD::DecodeCode39AndCode93FullASCII(string *encoded,char *ctrl)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  reference pcVar3;
  char *in_RDX;
  string *in_RSI;
  string *in_RDI;
  char next;
  char c;
  const_iterator in;
  iterator out;
  undefined7 in_stack_ffffffffffffff78;
  char in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  string *this_00;
  undefined8 local_50;
  undefined8 local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  char local_32;
  char local_31;
  undefined8 local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_20;
  char *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  local_20 = std::__cxx11::string::begin();
  local_28._M_current = (char *)std::__cxx11::string::cbegin();
  do {
    local_30 = std::__cxx11::string::cend();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    if (!bVar1) {
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      std::__cxx11::string::erase(in_RSI,local_48,local_50);
      std::__cxx11::string::string((string *)this_00,in_RSI);
      return in_RDI;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_28);
    local_31 = *pcVar2;
    bVar1 = Contains((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff7f);
    if (bVar1) {
      this = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator++(&local_28);
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(this);
      local_32 = *pcVar2;
      if ((local_32 < 'A') || ('Z' < local_32)) {
        std::__cxx11::string::string((string *)this_00);
        return in_RDI;
      }
      if (local_31 == *local_18) {
        local_31 = local_32 + -0x40;
      }
      else if (local_31 == local_18[1]) {
        local_31 = PERCENTAGE_MAPPING[local_32 + -0x41];
      }
      else if (local_31 == local_18[2]) {
        local_31 = local_32 + -0x20;
      }
      else {
        local_31 = local_32 + ' ';
      }
    }
    in_stack_ffffffffffffff84 = CONCAT13(local_31,(int3)in_stack_ffffffffffffff84);
    local_40 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)this_00,in_stack_ffffffffffffff84);
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_40);
    *pcVar3 = (char)((uint)in_stack_ffffffffffffff84 >> 0x18);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

std::string DecodeCode39AndCode93FullASCII(std::string encoded, const char ctrl[4])
{
	auto out = encoded.begin();
	for (auto in = encoded.cbegin(); in != encoded.cend(); ++in) {
		char c = *in;
		if (Contains(ctrl, c)) {
			char next = *++in; // if in is one short of cend(), then next == 0
			if (next < 'A' || next > 'Z')
				return {};
			if (c == ctrl[0])
				c = next - 64; // $A to $Z map to control codes SH to SB
			else if (c == ctrl[1])
				c = PERCENTAGE_MAPPING[next - 'A'];
			else if (c == ctrl[2])
				c = next - 32; // /A to /O map to ! to , and /Z maps to :
			else
				c = next + 32; // +A to +Z map to a to z
		}
		*out++ = c;
	}
	encoded.erase(out, encoded.end());
	return encoded;
}